

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O0

size_t x11_send(Channel *chan,_Bool is_stderr,void *vdata,size_t len)

{
  undefined1 uVar1;
  char endian_00;
  int iVar2;
  bool bVar3;
  _Bool _Var4;
  uint16_t uVar5;
  void *pvVar6;
  SockAddr *addr;
  Plug *plug;
  Conf *conf;
  Socket *pSVar7;
  char *pcVar8;
  byte *pbVar9;
  char *err_message;
  char local_b8 [3];
  char endian_1;
  int new_peer_port;
  char new_peer_addr [32];
  int socketdatalen;
  uchar *socketdata;
  void *pvStack_80;
  int greeting_len;
  void *greeting;
  uint local_70;
  int protominor;
  int protomajor;
  int peer_port;
  unsigned_long peer_ip;
  X11FakeAuth *auth_matched;
  char *err;
  undefined1 *puStack_48;
  char endian;
  char *data;
  X11Connection *xconn;
  size_t len_local;
  void *vdata_local;
  Channel *pCStack_20;
  _Bool is_stderr_local;
  Channel *chan_local;
  
  xconn = (X11Connection *)len;
  len_local = (size_t)vdata;
  vdata_local._7_1_ = is_stderr;
  pCStack_20 = chan;
  if (chan->vt != &X11Connection_channelvt) {
    __assert_fail("chan->vt == &X11Connection_channelvt",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c",
                  0x1ce,"size_t x11_send(Channel *, _Bool, const void *, size_t)");
  }
  data = (char *)(chan + -7);
  puStack_48 = (undefined1 *)vdata;
  while( true ) {
    bVar3 = false;
    if (xconn != (X11Connection *)0x0) {
      bVar3 = *(int *)&chan[-4].vt < 0xc;
    }
    if (!bVar3) break;
    xconn = (X11Connection *)&xconn[-1].chan.field_0xf;
    uVar1 = *puStack_48;
    iVar2 = *(int *)&chan[-4].vt;
    *(int *)&chan[-4].vt = iVar2 + 1;
    *(undefined1 *)((long)&((Channel *)data)->vt + (long)iVar2) = uVar1;
    puStack_48 = puStack_48 + 1;
  }
  if (*(int *)&chan[-4].vt < 0xc) {
    chan_local = (Channel *)0x0;
  }
  else {
    if (chan[-5].vt == (ChannelVtable *)0x0) {
      err._7_1_ = *(char *)&((Channel *)data)->vt;
      uVar5 = GET_16BIT_X11(err._7_1_,(void *)((long)&chan[-7].vt + 6));
      *(uint *)(data + 0x34) = (uint)uVar5;
      uVar5 = GET_16BIT_X11(err._7_1_,data + 8);
      *(uint *)(data + 0x3c) = (uint)uVar5;
      *(uint *)(data + 0x38) = *(int *)(data + 0x34) + 3U & 0xfffffffc;
      *(uint *)(data + 0x40) = *(int *)(data + 0x3c) + 3U & 0xfffffffc;
      pvVar6 = safemalloc((long)(*(int *)(data + 0x38) + 1),1,0);
      *(void **)(data + 0x20) = pvVar6;
      pvVar6 = safemalloc((long)*(int *)(data + 0x40),1,0);
      *(void **)(data + 0x28) = pvVar6;
    }
    while( true ) {
      bVar3 = false;
      if (xconn != (X11Connection *)0x0) {
        bVar3 = *(int *)(data + 0x30) < *(int *)(data + 0x38) + 0xc;
      }
      if (!bVar3) break;
      xconn = (X11Connection *)&xconn[-1].chan.field_0xf;
      uVar1 = *puStack_48;
      iVar2 = *(int *)(data + 0x30);
      *(int *)(data + 0x30) = iVar2 + 1;
      *(undefined1 *)(*(long *)(data + 0x20) + (long)(iVar2 + -0xc)) = uVar1;
      puStack_48 = puStack_48 + 1;
    }
    while( true ) {
      bVar3 = false;
      if (xconn != (X11Connection *)0x0) {
        bVar3 = *(int *)(data + 0x30) < *(int *)(data + 0x38) + 0xc + *(int *)(data + 0x40);
      }
      if (!bVar3) break;
      xconn = (X11Connection *)&xconn[-1].chan.field_0xf;
      uVar1 = *puStack_48;
      iVar2 = *(int *)(data + 0x30);
      *(int *)(data + 0x30) = iVar2 + 1;
      *(undefined1 *)(*(long *)(data + 0x28) + (long)((iVar2 + -0xc) - *(int *)(data + 0x38))) =
           uVar1;
      puStack_48 = puStack_48 + 1;
    }
    if (*(int *)(data + 0x30) < *(int *)(data + 0x38) + 0xc + *(int *)(data + 0x40)) {
      chan_local = (Channel *)0x0;
    }
    else {
      if ((data[0x44] & 1U) == 0) {
        peer_ip = 0;
        endian_00 = *data;
        uVar5 = GET_16BIT_X11(endian_00,data + 2);
        local_70 = (uint)uVar5;
        uVar5 = GET_16BIT_X11(endian_00,data + 4);
        greeting._4_4_ = (uint)uVar5;
        if (*(long *)(data + 0x60) != 0) {
          __assert_fail("!xconn->s",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                        ,0x20a,"size_t x11_send(Channel *, _Bool, const void *, size_t)");
        }
        *(undefined1 *)(*(long *)(data + 0x20) + (long)*(int *)(data + 0x34)) = 0;
        _protomajor = 0;
        _Var4 = x11_parse_ip(*(char **)(data + 0x48),(unsigned_long *)&protomajor);
        if (_Var4) {
          protominor = *(int *)(data + 0x50);
        }
        else {
          protominor = -1;
        }
        auth_matched = (X11FakeAuth *)
                       x11_verify(_protomajor,protominor,*(tree234 **)(data + 0x10),
                                  *(char **)(data + 0x20),*(uchar **)(data + 0x28),
                                  *(int *)(data + 0x3c),(X11FakeAuth **)&peer_ip);
        if (auth_matched != (X11FakeAuth *)0x0) {
          x11_send_init_error((X11Connection *)data,(char *)auth_matched);
          return 0;
        }
        if (peer_ip == 0) {
          __assert_fail("auth_matched",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                        ,0x21b,"size_t x11_send(Channel *, _Bool, const void *, size_t)");
        }
        if (*(long *)(peer_ip + 0x40) != 0) {
          sshfwd_x11_sharing_handover
                    (*(SshChannel **)(data + 0x58),*(ssh_sharing_connstate **)(peer_ip + 0x40),
                     *(share_channel **)(peer_ip + 0x48),*(char **)(data + 0x48),
                     *(int *)(data + 0x50),(uint)(byte)*data,local_70,greeting._4_4_,puStack_48,
                     (int)xconn);
          return 0;
        }
        data[0x78] = '\0';
        data[0x79] = '\0';
        data[0x7a] = '\0';
        data[0x7b] = '\0';
        sshfwd_window_override_removed(*(SshChannel **)(data + 0x58));
        *(undefined8 *)(data + 0x18) = *(undefined8 *)(peer_ip + 0x38);
        addr = sk_addr_dup(*(SockAddr **)(*(long *)(data + 0x18) + 0x20));
        pcVar8 = *(char **)(*(long *)(data + 0x18) + 0x30);
        iVar2 = *(int *)(*(long *)(data + 0x18) + 0x28);
        plug = (Plug *)(data + 0x68);
        conf = sshfwd_get_conf(*(SshChannel **)(data + 0x58));
        pSVar7 = new_connection(addr,pcVar8,iVar2,false,true,false,false,plug,conf,(Interactor *)0x0
                               );
        *(Socket **)(data + 0x60) = pSVar7;
        auth_matched = (X11FakeAuth *)sk_socket_error(*(Socket **)(data + 0x60));
        if (auth_matched != (X11FakeAuth *)0x0) {
          pcVar8 = dupprintf("unable to connect to forwarded X server: %s",auth_matched);
          x11_send_init_error((X11Connection *)data,pcVar8);
          safefree(pcVar8);
          return 0;
        }
        new_peer_addr[0x1c] = '\0';
        new_peer_addr[0x1d] = '\0';
        new_peer_addr[0x1e] = '\0';
        new_peer_addr[0x1f] = '\0';
        pbVar9 = (byte *)sk_getxdmdata(*(Socket **)(data + 0x60),(int *)(new_peer_addr + 0x1c));
        if ((pbVar9 == (byte *)0x0) || (new_peer_addr._28_4_ != 6)) {
          strcpy(local_b8,"0.0.0.0");
          err_message._4_4_ = 0;
        }
        else {
          sprintf(local_b8,"%d.%d.%d.%d",(ulong)*pbVar9,(ulong)pbVar9[1],(ulong)pbVar9[2],
                  (ulong)pbVar9[3]);
          uVar5 = GET_16BIT_MSB_FIRST(pbVar9 + 4);
          err_message._4_4_ = (uint)uVar5;
        }
        pvStack_80 = x11_make_greeting((uint)(byte)*data,local_70,greeting._4_4_,
                                       *(int *)(*(long *)(data + 0x18) + 0x38),
                                       *(void **)(*(long *)(data + 0x18) + 0x40),
                                       *(int *)(*(long *)(data + 0x18) + 0x48),local_b8,
                                       err_message._4_4_,(int *)((long)&socketdata + 4));
        sk_write(*(Socket **)(data + 0x60),pvStack_80,(long)socketdata._4_4_);
        smemclr(pvStack_80,(long)socketdata._4_4_);
        safefree(pvStack_80);
        data[0x44] = '\x01';
      }
      chan_local = (Channel *)sk_write(*(Socket **)(data + 0x60),puStack_48,(size_t)xconn);
    }
  }
  return (size_t)chan_local;
}

Assistant:

static size_t x11_send(
    Channel *chan, bool is_stderr, const void *vdata, size_t len)
{
    assert(chan->vt == &X11Connection_channelvt);
    X11Connection *xconn = container_of(chan, X11Connection, chan);
    const char *data = (const char *)vdata;

    /*
     * Read the first packet.
     */
    while (len > 0 && xconn->data_read < 12)
        xconn->firstpkt[xconn->data_read++] = (unsigned char) (len--, *data++);
    if (xconn->data_read < 12)
        return 0;

    /*
     * If we have not allocated the auth_protocol and auth_data
     * strings, do so now.
     */
    if (!xconn->auth_protocol) {
        char endian = xconn->firstpkt[0];
        xconn->auth_plen = GET_16BIT_X11(endian, xconn->firstpkt + 6);
        xconn->auth_dlen = GET_16BIT_X11(endian, xconn->firstpkt + 8);
        xconn->auth_psize = (xconn->auth_plen + 3) & ~3;
        xconn->auth_dsize = (xconn->auth_dlen + 3) & ~3;
        /* Leave room for a terminating zero, to make our lives easier. */
        xconn->auth_protocol = snewn(xconn->auth_psize + 1, char);
        xconn->auth_data = snewn(xconn->auth_dsize, unsigned char);
    }

    /*
     * Read the auth_protocol and auth_data strings.
     */
    while (len > 0 &&
           xconn->data_read < 12 + xconn->auth_psize)
        xconn->auth_protocol[xconn->data_read++ - 12] = (len--, *data++);
    while (len > 0 &&
           xconn->data_read < 12 + xconn->auth_psize + xconn->auth_dsize)
        xconn->auth_data[xconn->data_read++ - 12 -
                      xconn->auth_psize] = (unsigned char) (len--, *data++);
    if (xconn->data_read < 12 + xconn->auth_psize + xconn->auth_dsize)
        return 0;

    /*
     * If we haven't verified the authorisation, do so now.
     */
    if (!xconn->verified) {
        const char *err;
        struct X11FakeAuth *auth_matched = NULL;
        unsigned long peer_ip;
        int peer_port;
        int protomajor, protominor;
        void *greeting;
        int greeting_len;
        unsigned char *socketdata;
        int socketdatalen;
        char new_peer_addr[32];
        int new_peer_port;
        char endian = xconn->firstpkt[0];

        protomajor = GET_16BIT_X11(endian, xconn->firstpkt + 2);
        protominor = GET_16BIT_X11(endian, xconn->firstpkt + 4);

        assert(!xconn->s);

        xconn->auth_protocol[xconn->auth_plen] = '\0';  /* ASCIZ */

        peer_ip = 0;                   /* placate optimiser */
        if (x11_parse_ip(xconn->peer_addr, &peer_ip))
            peer_port = xconn->peer_port;
        else
            peer_port = -1; /* signal no peer address data available */

        err = x11_verify(peer_ip, peer_port,
                         xconn->authtree, xconn->auth_protocol,
                         xconn->auth_data, xconn->auth_dlen, &auth_matched);
        if (err) {
            x11_send_init_error(xconn, err);
            return 0;
        }
        assert(auth_matched);

        /*
         * If this auth points to a connection-sharing downstream
         * rather than an X display we know how to connect to
         * directly, pass it off to the sharing module now. (This will
         * have the side effect of freeing xconn.)
         */
        if (auth_matched->share_cs) {
            sshfwd_x11_sharing_handover(xconn->c, auth_matched->share_cs,
                                        auth_matched->share_chan,
                                        xconn->peer_addr, xconn->peer_port,
                                        xconn->firstpkt[0],
                                        protomajor, protominor, data, len);
            return 0;
        }

        /*
         * Now we know we're going to accept the connection, and what
         * X display to connect to. Actually connect to it.
         */
        xconn->chan.initial_fixed_window_size = 0;
        sshfwd_window_override_removed(xconn->c);
        xconn->disp = auth_matched->disp;
        xconn->s = new_connection(sk_addr_dup(xconn->disp->addr),
                                  xconn->disp->realhost, xconn->disp->port,
                                  false, true, false, false, &xconn->plug,
                                  sshfwd_get_conf(xconn->c), NULL);
        if ((err = sk_socket_error(xconn->s)) != NULL) {
            char *err_message = dupprintf("unable to connect to"
                                          " forwarded X server: %s", err);
            x11_send_init_error(xconn, err_message);
            sfree(err_message);
            return 0;
        }

        /*
         * Write a new connection header containing our replacement
         * auth data.
         */
        socketdatalen = 0;             /* placate compiler warning */
        socketdata = sk_getxdmdata(xconn->s, &socketdatalen);
        if (socketdata && socketdatalen==6) {
            sprintf(new_peer_addr, "%d.%d.%d.%d", socketdata[0],
                    socketdata[1], socketdata[2], socketdata[3]);
            new_peer_port = GET_16BIT_MSB_FIRST(socketdata + 4);
        } else {
            strcpy(new_peer_addr, "0.0.0.0");
            new_peer_port = 0;
        }

        greeting = x11_make_greeting(xconn->firstpkt[0],
                                     protomajor, protominor,
                                     xconn->disp->localauthproto,
                                     xconn->disp->localauthdata,
                                     xconn->disp->localauthdatalen,
                                     new_peer_addr, new_peer_port,
                                     &greeting_len);

        sk_write(xconn->s, greeting, greeting_len);

        smemclr(greeting, greeting_len);
        sfree(greeting);

        /*
         * Now we're done.
         */
        xconn->verified = true;
    }

    /*
     * After initialisation, just copy data simply.
     */

    return sk_write(xconn->s, data, len);
}